

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_YIELD(DisasContext_conflict1 *s,arg_YIELD *a)

{
  TCGContext_conflict1 *tcg_ctx;
  TranslationBlock *extraout_RAX;
  TranslationBlock *pTVar1;
  
  pTVar1 = (s->base).tb;
  if ((pTVar1->cflags & 0x80000) == 0) {
    tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_R[0xf] + (long)tcg_ctx),
                        (long)(int)(s->base).pc_next);
    (s->base).is_jmp = DISAS_TARGET_7;
    pTVar1 = extraout_RAX;
  }
  return SUB81(pTVar1,0);
}

Assistant:

static bool trans_YIELD(DisasContext *s, arg_YIELD *a)
{
    /*
     * When running single-threaded TCG code, use the helper to ensure that
     * the next round-robin scheduled vCPU gets a crack.  When running in
     * MTTCG we don't generate jumps to the helper as it won't affect the
     * scheduling of other vCPUs.
     */
    if (!(tb_cflags(s->base.tb) & CF_PARALLEL)) {
        gen_set_pc_im(s, s->base.pc_next);
        s->base.is_jmp = DISAS_YIELD;
    }
    return true;
}